

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O2

void __thiscall TcpConnection::do_read(TcpConnection *this)

{
  int iVar1;
  Logger *pLVar2;
  __shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar1 = InputBuffer::read_from_fd(&this->tc_ibuf,this->tc_fd);
  if (iVar1 == 0) {
    pLVar2 = Logger::get_instance();
    if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","do_read",0x33);
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"do_read",0x33,LOG_LEVEL_INFO,"connection closed by peer\n");
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
    }
  }
  else {
    if (iVar1 != -1) {
      std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
                (local_30,(__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::operator()
                (&this->tc_message_cb,(shared_ptr<TcpConnection> *)local_30,&this->tc_ibuf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      return;
    }
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] read data from socket error\n","error","do_read",0x2e);
    }
  }
  do_close(this);
  return;
}

Assistant:

void TcpConnection::do_read() {
    if (int ret = tc_ibuf.read_from_fd(tc_fd); ret == -1) {
        PR_ERROR("read data from socket error\n");
        this->do_close();
        return;
    }
    else if (ret == 0) {
        LOG_INFO("connection closed by peer\n");
        this->do_close();
        return;
    }

    tc_message_cb(shared_from_this(), &tc_ibuf);

    return;
}